

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void measureAllocationSize(sqlite3 *db,void *p)

{
  uint uVar1;
  
  if ((db != (sqlite3 *)0x0) && (p < (db->lookaside).pEnd)) {
    uVar1 = 0x80;
    if ((db->lookaside).pMiddle <= p) goto LAB_0012664e;
    if ((db->lookaside).pStart <= p) {
      uVar1 = (uint)(db->lookaside).szTrue;
      goto LAB_0012664e;
    }
  }
  uVar1 = (*sqlite3Config.m.xSize)(p);
LAB_0012664e:
  *db->pnBytesFreed = *db->pnBytesFreed + uVar1;
  return;
}

Assistant:

static SQLITE_NOINLINE void measureAllocationSize(sqlite3 *db, void *p){
  *db->pnBytesFreed += sqlite3DbMallocSize(db,p);
}